

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emitter.cpp
# Opt level: O1

value YAML::GetStringEscapingStyle(EMITTER_MANIP emitterManip)

{
  value vVar1;
  
  vVar1 = NonAscii;
  if (emitterManip != EscapeNonAscii) {
    vVar1 = (uint)(emitterManip == EscapeAsJson) * 2;
  }
  return vVar1;
}

Assistant:

StringEscaping::value GetStringEscapingStyle(const EMITTER_MANIP emitterManip) {
  switch (emitterManip) {
    case EscapeNonAscii:
      return StringEscaping::NonAscii;
    case EscapeAsJson:
      return StringEscaping::JSON;
    default:
      return StringEscaping::None;
      break;
  }
}